

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  Fad<double> *pFVar7;
  ulong uVar8;
  ulong uVar9;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar10;
  double dVar11;
  
  pFVar10 = (fadexpr->fadexpr_).right_;
  pFVar7 = (pFVar10->fadexpr_).right_;
  uVar1 = (pFVar7->dx_).num_elts;
  uVar9 = (ulong)uVar1;
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00dbe5a6;
    pdVar6 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
          pFVar10 = (fadexpr->fadexpr_).right_;
          pFVar7 = (pFVar10->fadexpr_).right_;
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00dbe5a6;
    }
    if (uVar2 != 0) {
      pdVar6 = (this->dx_).ptr_to_data;
      if (pdVar6 != (double *)0x0) {
        operator_delete__(pdVar6);
        pFVar10 = (fadexpr->fadexpr_).right_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = uVar9 * 8;
    }
    pdVar6 = (double *)operator_new__(uVar8);
    (this->dx_).ptr_to_data = pdVar6;
    pFVar7 = (pFVar10->fadexpr_).right_;
    if ((pFVar7->dx_).num_elts == 0) {
      if (0 < (int)uVar1) {
        iVar3 = (fadexpr->fadexpr_).left_.constant_;
        iVar4 = (pFVar10->fadexpr_).left_.constant_;
        uVar8 = 0;
        do {
          dVar11 = pFVar7->val_ + (double)iVar4;
          pdVar6[uVar8] = (-pFVar7->defaultVal * (double)iVar3) / (dVar11 * dVar11);
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      goto LAB_00dbe5a6;
    }
  }
  if (0 < (int)uVar1) {
    pdVar5 = (pFVar7->dx_).ptr_to_data;
    iVar3 = (fadexpr->fadexpr_).left_.constant_;
    iVar4 = (pFVar10->fadexpr_).left_.constant_;
    uVar8 = 0;
    do {
      dVar11 = pFVar7->val_ + (double)iVar4;
      pdVar6[uVar8] = (-pdVar5[uVar8] * (double)iVar3) / (dVar11 * dVar11);
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
LAB_00dbe5a6:
  this->val_ = (double)(fadexpr->fadexpr_).left_.constant_ /
               ((double)(pFVar10->fadexpr_).left_.constant_ + pFVar7->val_);
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}